

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O0

void __thiscall BS::thread_pool::wait_for_tasks(thread_pool *this)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> tasks_lock;
  thread_pool *this_local;
  
  tasks_lock._8_8_ = this;
  std::atomic<bool>::operator=(&this->waiting,true);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->tasks_mutex);
  std::condition_variable::wait<BS::thread_pool::wait_for_tasks()::_lambda()_1_>
            (&this->task_done_cv,(unique_lock<std::mutex> *)local_20,(anon_class_8_1_8991fb9c)this);
  std::atomic<bool>::operator=(&this->waiting,false);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void wait_for_tasks()
    {
        waiting = true;
        std::unique_lock<std::mutex> tasks_lock(tasks_mutex);
        task_done_cv.wait(tasks_lock, [this] { return (tasks_total == (paused ? tasks.size() : 0)); });
        waiting = false;
    }